

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void attachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  Btree **ppBtree;
  int *piVar1;
  uint uVar2;
  sqlite3 *db;
  Db *pDVar3;
  Pager *pPVar4;
  Btree *pBVar5;
  char *pcVar6;
  Btree *pBVar7;
  Schema *pSVar8;
  long lVar9;
  undefined7 uVar10;
  u8 uVar11;
  undefined7 uVar12;
  sqlite3_context *psVar13;
  int iVar14;
  int iVar15;
  char *pcVar16;
  char *zRight;
  Db *pDVar17;
  Schema *pSVar18;
  u64 n;
  long lVar19;
  char *zErrDyn;
  uint flags;
  char *zErr;
  char *zPath;
  sqlite3_vfs *pVfs;
  char *local_68;
  sqlite3_context *local_60;
  uint local_54;
  char *local_50;
  char *local_48;
  char *local_40;
  sqlite3_vfs *local_38;
  
  db = context->pOut->db;
  iVar14 = 0;
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_68 = (char *)0x0;
  pcVar16 = (char *)sqlite3ValueText(*argv,'\x01');
  zRight = (char *)sqlite3ValueText(argv[1],'\x01');
  if (pcVar16 == (char *)0x0) {
    pcVar16 = "";
  }
  if (zRight == (char *)0x0) {
    zRight = "";
  }
  uVar2 = db->nDb;
  if ((int)uVar2 < db->aLimit[7] + 2) {
    if (db->autoCommit == '\0') {
      iVar14 = 0;
      local_68 = sqlite3MPrintf(db,"cannot ATTACH database within transaction");
      goto LAB_0016c910;
    }
    pDVar17 = db->aDb;
    local_60 = context;
    local_50 = pcVar16;
    if (0 < (int)uVar2) {
      lVar19 = 0;
      do {
        iVar14 = sqlite3_stricmp(*(char **)((long)&pDVar17->zName + lVar19),zRight);
        if (iVar14 == 0) {
          iVar14 = 0;
          local_68 = sqlite3MPrintf(db,"database %s is already in use",zRight);
          context = local_60;
          goto LAB_0016c910;
        }
        lVar19 = lVar19 + 0x20;
      } while ((ulong)uVar2 << 5 != lVar19);
    }
    if (pDVar17 == db->aDbStatic) {
      pDVar17 = (Db *)sqlite3DbMallocRaw(db,0x60);
      if (pDVar17 == (Db *)0x0) {
        return;
      }
      pDVar3 = db->aDb;
      pcVar16 = pDVar3->zName;
      pBVar5 = pDVar3->pBt;
      uVar11 = pDVar3->safety_level;
      uVar12 = *(undefined7 *)&pDVar3->field_0x11;
      pSVar18 = pDVar3->pSchema;
      pcVar6 = pDVar3[1].zName;
      pBVar7 = pDVar3[1].pBt;
      uVar10 = *(undefined7 *)&pDVar3[1].field_0x11;
      pSVar8 = pDVar3[1].pSchema;
      pDVar17[1].safety_level = pDVar3[1].safety_level;
      *(undefined7 *)&pDVar17[1].field_0x11 = uVar10;
      pDVar17[1].pSchema = pSVar8;
      pDVar17[1].zName = pcVar6;
      pDVar17[1].pBt = pBVar7;
      pDVar17->safety_level = uVar11;
      *(undefined7 *)&pDVar17->field_0x11 = uVar12;
      pDVar17->pSchema = pSVar18;
      pDVar17->zName = pcVar16;
      pDVar17->pBt = pBVar5;
    }
    else {
      pDVar17 = (Db *)sqlite3DbRealloc(db,pDVar17,(long)(int)uVar2 * 0x20 + 0x20);
      if (pDVar17 == (Db *)0x0) {
        return;
      }
    }
    psVar13 = local_60;
    db->aDb = pDVar17;
    iVar14 = db->nDb;
    *(undefined8 *)&pDVar17[iVar14].safety_level = 0;
    *(Schema **)(&pDVar17[iVar14].safety_level + 8) = (Schema *)0x0;
    pDVar17[iVar14].zName = (char *)0x0;
    pDVar17[iVar14].pBt = (Btree *)0x0;
    local_54 = db->openFlags;
    iVar15 = sqlite3ParseUri(db->pVfs->zName,local_50,&local_54,&local_38,&local_40,&local_48);
    pcVar6 = local_40;
    pcVar16 = local_48;
    if (iVar15 != 0) {
      if (iVar15 == 7) {
        db->mallocFailed = '\x01';
      }
      psVar13->isError = 1;
      psVar13->fErrorOrAux = '\x01';
      sqlite3VdbeMemSetStr
                (psVar13->pOut,local_48,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
      sqlite3_free(pcVar16);
      return;
    }
    pDVar17 = pDVar17 + iVar14;
    local_54 = local_54 | 0x100;
    ppBtree = &pDVar17->pBt;
    iVar15 = sqlite3BtreeOpen(local_38,local_40,db,ppBtree,0,local_54);
    sqlite3_free(pcVar6);
    db->nDb = db->nDb + 1;
    if (iVar15 == 0) {
      pSVar18 = sqlite3SchemaGet(db,pDVar17->pBt);
      pDVar17->pSchema = pSVar18;
      if (pSVar18 == (Schema *)0x0) {
        iVar15 = 7;
      }
      else {
        iVar15 = 0;
        if ((pSVar18->file_format != '\0') && (pSVar18->enc != db->enc)) {
          local_68 = sqlite3MPrintf(db,
                                    "attached databases must use the same text encoding as main database"
                                   );
          iVar15 = 1;
        }
      }
      sqlite3BtreeEnter(*ppBtree);
      pBVar5 = *ppBtree;
      pPVar4 = pBVar5->pBt->pPager;
      if (pPVar4->tempFile == '\0') {
        if ((pPVar4->pWal == (Wal *)0x0) || (pPVar4->pWal->exclusiveMode != '\x02')) {
          pPVar4->exclusiveMode = db->dfltLockMode;
        }
      }
      iVar14 = sqlite3BtreeSecureDelete(db->aDb->pBt,-1);
      sqlite3BtreeSecureDelete(pBVar5,iVar14);
      sqlite3BtreeSetPagerFlags(*ppBtree,db->flags & 0x1cU | 3);
      pBVar5 = *ppBtree;
      if (pBVar5->sharable != '\0') {
        piVar1 = &pBVar5->wantToLock;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          unlockBtreeMutex(pBVar5);
        }
      }
    }
    else if (iVar15 == 0x13) {
      local_68 = sqlite3MPrintf(db,"database is already attached");
      iVar15 = 1;
    }
    pDVar17->safety_level = '\x03';
    lVar19 = -1;
    do {
      lVar9 = lVar19 + 1;
      lVar19 = lVar19 + 1;
    } while (zRight[lVar9] != '\0');
    n = (ulong)((uint)lVar19 & 0x3fffffff) + 1;
    pcVar16 = (char *)sqlite3DbMallocRaw(db,n);
    if (pcVar16 == (char *)0x0) {
      iVar14 = 7;
    }
    else {
      memcpy(pcVar16,zRight,n);
      iVar14 = 0;
    }
    pDVar17->zName = pcVar16;
    if (iVar15 != 0) {
      iVar14 = iVar15;
    }
    if (iVar14 == 0) {
      sqlite3BtreeEnterAll(db);
      iVar14 = sqlite3Init(db,&local_68);
      sqlite3BtreeLeaveAll(db);
      if (iVar14 == 0) {
        return;
      }
    }
    lVar19 = (long)db->nDb + -1;
    pBVar5 = db->aDb[lVar19].pBt;
    if (pBVar5 != (Btree *)0x0) {
      sqlite3BtreeClose(pBVar5);
      pDVar17 = db->aDb;
      pDVar17[lVar19].pBt = (Btree *)0x0;
      pDVar17[lVar19].pSchema = (Schema *)0x0;
    }
    sqlite3ResetAllSchemasOfConnection(db);
    context = local_60;
    db->nDb = (int)lVar19;
    if ((iVar14 == 0xc0a) || (iVar14 == 7)) {
      db->mallocFailed = '\x01';
      sqlite3DbFree(db,local_68);
      local_68 = sqlite3MPrintf(db,"out of memory");
      context = local_60;
      goto LAB_0016c910;
    }
    if (local_68 == (char *)0x0) {
      local_68 = sqlite3MPrintf(db,"unable to open database: %s",local_50);
      goto LAB_0016c910;
    }
  }
  else {
    local_68 = sqlite3MPrintf(db,"too many attached databases - max %d");
LAB_0016c910:
    if (local_68 == (char *)0x0) goto LAB_0016c94a;
  }
  context->isError = 1;
  context->fErrorOrAux = '\x01';
  sqlite3VdbeMemSetStr(context->pOut,local_68,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  sqlite3DbFree(db,local_68);
LAB_0016c94a:
  if (iVar14 != 0) {
    sqlite3_result_error_code(context,iVar14);
  }
  return;
}

Assistant:

static void attachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  int i;
  int rc = 0;
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zName;
  const char *zFile;
  char *zPath = 0;
  char *zErr = 0;
  unsigned int flags;
  Db *aNew;
  char *zErrDyn = 0;
  sqlite3_vfs *pVfs;

  UNUSED_PARAMETER(NotUsed);

  zFile = (const char *)sqlite3_value_text(argv[0]);
  zName = (const char *)sqlite3_value_text(argv[1]);
  if( zFile==0 ) zFile = "";
  if( zName==0 ) zName = "";

  /* Check for the following errors:
  **
  **     * Too many attached databases,
  **     * Transaction currently open
  **     * Specified database name already being used.
  */
  if( db->nDb>=db->aLimit[SQLITE_LIMIT_ATTACHED]+2 ){
    zErrDyn = sqlite3MPrintf(db, "too many attached databases - max %d", 
      db->aLimit[SQLITE_LIMIT_ATTACHED]
    );
    goto attach_error;
  }
  if( !db->autoCommit ){
    zErrDyn = sqlite3MPrintf(db, "cannot ATTACH database within transaction");
    goto attach_error;
  }
  for(i=0; i<db->nDb; i++){
    char *z = db->aDb[i].zName;
    assert( z && zName );
    if( sqlite3StrICmp(z, zName)==0 ){
      zErrDyn = sqlite3MPrintf(db, "database %s is already in use", zName);
      goto attach_error;
    }
  }

  /* Allocate the new entry in the db->aDb[] array and initialize the schema
  ** hash tables.
  */
  if( db->aDb==db->aDbStatic ){
    aNew = sqlite3DbMallocRaw(db, sizeof(db->aDb[0])*3 );
    if( aNew==0 ) return;
    memcpy(aNew, db->aDb, sizeof(db->aDb[0])*2);
  }else{
    aNew = sqlite3DbRealloc(db, db->aDb, sizeof(db->aDb[0])*(db->nDb+1) );
    if( aNew==0 ) return;
  }
  db->aDb = aNew;
  aNew = &db->aDb[db->nDb];
  memset(aNew, 0, sizeof(*aNew));

  /* Open the database file. If the btree is successfully opened, use
  ** it to obtain the database schema. At this point the schema may
  ** or may not be initialized.
  */
  flags = db->openFlags;
  rc = sqlite3ParseUri(db->pVfs->zName, zFile, &flags, &pVfs, &zPath, &zErr);
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_NOMEM ) db->mallocFailed = 1;
    sqlite3_result_error(context, zErr, -1);
    sqlite3_free(zErr);
    return;
  }
  assert( pVfs );
  flags |= SQLITE_OPEN_MAIN_DB;
  rc = sqlite3BtreeOpen(pVfs, zPath, db, &aNew->pBt, 0, flags);
  sqlite3_free( zPath );
  db->nDb++;
  if( rc==SQLITE_CONSTRAINT ){
    rc = SQLITE_ERROR;
    zErrDyn = sqlite3MPrintf(db, "database is already attached");
  }else if( rc==SQLITE_OK ){
    Pager *pPager;
    aNew->pSchema = sqlite3SchemaGet(db, aNew->pBt);
    if( !aNew->pSchema ){
      rc = SQLITE_NOMEM;
    }else if( aNew->pSchema->file_format && aNew->pSchema->enc!=ENC(db) ){
      zErrDyn = sqlite3MPrintf(db, 
        "attached databases must use the same text encoding as main database");
      rc = SQLITE_ERROR;
    }
    sqlite3BtreeEnter(aNew->pBt);
    pPager = sqlite3BtreePager(aNew->pBt);
    sqlite3PagerLockingMode(pPager, db->dfltLockMode);
    sqlite3BtreeSecureDelete(aNew->pBt,
                             sqlite3BtreeSecureDelete(db->aDb[0].pBt,-1) );
#ifndef SQLITE_OMIT_PAGER_PRAGMAS
    sqlite3BtreeSetPagerFlags(aNew->pBt, 3 | (db->flags & PAGER_FLAGS_MASK));
#endif
    sqlite3BtreeLeave(aNew->pBt);
  }
  aNew->safety_level = 3;
  aNew->zName = sqlite3DbStrDup(db, zName);
  if( rc==SQLITE_OK && aNew->zName==0 ){
    rc = SQLITE_NOMEM;
  }


#ifdef SQLITE_HAS_CODEC
  if( rc==SQLITE_OK ){
    extern int sqlite3CodecAttach(sqlite3*, int, const void*, int);
    extern void sqlite3CodecGetKey(sqlite3*, int, void**, int*);
    int nKey;
    char *zKey;
    int t = sqlite3_value_type(argv[2]);
    switch( t ){
      case SQLITE_INTEGER:
      case SQLITE_FLOAT:
        zErrDyn = sqlite3DbStrDup(db, "Invalid key value");
        rc = SQLITE_ERROR;
        break;
        
      case SQLITE_TEXT:
      case SQLITE_BLOB:
        nKey = sqlite3_value_bytes(argv[2]);
        zKey = (char *)sqlite3_value_blob(argv[2]);
        rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        break;

      case SQLITE_NULL:
        /* No key specified.  Use the key from the main database */
        sqlite3CodecGetKey(db, 0, (void**)&zKey, &nKey);
        if( nKey>0 || sqlite3BtreeGetOptimalReserve(db->aDb[0].pBt)>0 ){
          rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        }
        break;
    }
  }
#endif

  /* If the file was opened successfully, read the schema for the new database.
  ** If this fails, or if opening the file failed, then close the file and 
  ** remove the entry from the db->aDb[] array. i.e. put everything back the way
  ** we found it.
  */
  if( rc==SQLITE_OK ){
    sqlite3BtreeEnterAll(db);
    rc = sqlite3Init(db, &zErrDyn);
    sqlite3BtreeLeaveAll(db);
  }
#ifdef SQLITE_USER_AUTHENTICATION
  if( rc==SQLITE_OK ){
    u8 newAuth = 0;
    rc = sqlite3UserAuthCheckLogin(db, zName, &newAuth);
    if( newAuth<db->auth.authLevel ){
      rc = SQLITE_AUTH_USER;
    }
  }
#endif
  if( rc ){
    int iDb = db->nDb - 1;
    assert( iDb>=2 );
    if( db->aDb[iDb].pBt ){
      sqlite3BtreeClose(db->aDb[iDb].pBt);
      db->aDb[iDb].pBt = 0;
      db->aDb[iDb].pSchema = 0;
    }
    sqlite3ResetAllSchemasOfConnection(db);
    db->nDb = iDb;
    if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
      db->mallocFailed = 1;
      sqlite3DbFree(db, zErrDyn);
      zErrDyn = sqlite3MPrintf(db, "out of memory");
    }else if( zErrDyn==0 ){
      zErrDyn = sqlite3MPrintf(db, "unable to open database: %s", zFile);
    }
    goto attach_error;
  }
  
  return;

attach_error:
  /* Return an error if we get here */
  if( zErrDyn ){
    sqlite3_result_error(context, zErrDyn, -1);
    sqlite3DbFree(db, zErrDyn);
  }
  if( rc ) sqlite3_result_error_code(context, rc);
}